

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rp.cpp
# Opt level: O1

void synchro_or_remove_pair<hf_queue<ll_el<unsigned_int,unsigned_int>,unsigned_int,unsigned_int>>
               (hf_queue<ll_el<unsigned_int,_unsigned_int>,_unsigned_int,_unsigned_int> *Q,TP_t *TP,
               text_t *T,cpair ab)

{
  undefined8 *puVar1;
  long lVar2;
  ll_el<unsigned_int,_unsigned_int> el;
  uint uVar3;
  uint uVar4;
  cpair cVar5;
  cpair cVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uStack_a0;
  uint uStack_68;
  
  uVar12 = (ulong)ab >> 0x20;
  lVar2 = *(long *)&(Q->H).H.
                    super__Vector_base<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>,_std::allocator<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[(ulong)ab & 0xffffffff].
                    super__Vector_base<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data;
  uVar8 = *(uint *)(lVar2 + 8 + uVar12 * 0xc);
  if ((uint)((ulong)*(undefined8 *)(lVar2 + uVar12 * 0xc) >> 0x21) < uVar8) {
    if (uVar8 < Q->min_freq) {
      puVar1 = (undefined8 *)(lVar2 + uVar12 * 0xc);
      *(uint *)(puVar1 + 1) = (Q->H).null.F_ab;
      *puVar1 = *(undefined8 *)&(Q->H).null;
      Q->current_size = Q->current_size - 1;
    }
    return;
  }
  uVar7 = (ulong)ab >> 0x20;
  uVar12 = *(ulong *)(*(long *)&(Q->H).H.
                                super__Vector_base<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>,_std::allocator<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[(ulong)ab & 0xffffffff].
                                super__Vector_base<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>
                                ._M_impl.super__Vector_impl_data + uVar7 * 0xc);
  uVar3 = (uint)uVar12;
  uVar8 = (int)(uVar12 >> 0x20) + uVar3;
  text_positions<unsigned_int,_unsigned_int,_ll_el<unsigned_int,_unsigned_int>_>::cluster
            (TP,uVar3,uVar8);
  uVar14 = 0;
  if (uVar3 < uVar8) {
    uVar3 = uVar8 - 1;
    uVar14 = 0;
    do {
      uVar11 = uVar12 & 0xffffffff;
      cVar5 = skippable_text<unsigned_int,_unsigned_int>::pair_starting_at
                        (T,(TP->TP).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start[uVar11]);
      uVar13 = 1;
      uVar4 = (uint)uVar12;
      uVar15 = cVar5.second;
      uVar9 = cVar5.first;
      uVar12 = uVar12 & 0xffffffff;
      uVar10 = uVar13;
      if (uVar4 < uVar3) {
        do {
          uVar12 = uVar11;
          uVar10 = uVar13;
          if (((T->BLANK == uVar15 && T->BLANK == uVar9) ||
              (cVar6 = skippable_text<unsigned_int,_unsigned_int>::pair_starting_at
                                 (T,(TP->TP).
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start[uVar11 + 1]),
              uVar9 != cVar6.first)) || (uVar15 != cVar6.second)) break;
          uVar11 = uVar11 + 1;
          uVar13 = uVar13 + 1;
          uVar12 = (ulong)uVar3;
          uVar10 = uVar8 - uVar4;
        } while (uVar3 != uVar11);
      }
      uStack_68 = ab.second;
      uVar13 = uVar14;
      if (uVar15 == uStack_68) {
        uVar13 = uVar10;
      }
      uStack_a0 = ab.first;
      if (uVar9 != uStack_a0) {
        uVar13 = uVar14;
      }
      uVar14 = uVar13;
      if (Q->min_freq <= uVar10) {
        if (uVar9 == uStack_a0 && uVar15 == uStack_68) {
          lVar2 = *(long *)&(Q->H).H.
                            super__Vector_base<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>,_std::allocator<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[(ulong)ab & 0xffffffff].
                            super__Vector_base<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>
                            ._M_impl.super__Vector_impl_data;
          *(uint *)(lVar2 + uVar7 * 0xc) = uVar4;
          *(uint *)(lVar2 + 4 + uVar7 * 0xc) = uVar10;
          *(uint *)(lVar2 + 8 + uVar7 * 0xc) = uVar10;
        }
        else {
          el.L_ab = uVar10;
          el.P_ab = uVar4;
          el.ab.first = cVar5.first;
          el.ab.second = cVar5.second;
          el.F_ab = uVar10;
          hf_queue<ll_el<unsigned_int,_unsigned_int>,_unsigned_int,_unsigned_int>::insert(Q,el);
        }
      }
      uVar10 = (int)uVar12 + 1;
      uVar12 = (ulong)uVar10;
    } while (uVar10 < uVar8);
  }
  if (uVar14 < Q->min_freq) {
    lVar2 = *(long *)&(Q->H).H.
                      super__Vector_base<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>,_std::allocator<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[(ulong)ab & 0xffffffff].
                      super__Vector_base<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data;
    *(uint *)(lVar2 + 8 + uVar7 * 0xc) = (Q->H).null.F_ab;
    *(undefined8 *)(lVar2 + uVar7 * 0xc) = *(undefined8 *)&(Q->H).null;
    Q->current_size = Q->current_size - 1;
  }
  return;
}

Assistant:

void synchro_or_remove_pair(queue_t & Q, TP_t & TP, text_t & T, cpair ab){

	assert(Q.contains(ab));

	auto q_el = Q[ab];
	itype F_ab = q_el.F_ab;
	itype L_ab = q_el.L_ab;

	if(F_ab <= L_ab/2){

		synchronize<queue_t>(Q, TP, T, ab);

	}else{

		if(F_ab < Q.minimum_frequency()){

			Q.remove(ab);

		}

	}

}